

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::modifyIntensityAperture_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int aperture,double size)

{
  double dVar1;
  pointer pdVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  int i;
  long lVar6;
  ulong uVar7;
  mapped_type mVar8;
  double dVar9;
  double local_68;
  value_type local_58;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  dVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[aperture];
  if (0.0 <= dVar1 + size) {
    dVar9 = (double)this->max_intensity;
    local_68 = size;
    if (dVar9 < dVar1 + size) {
      if (dVar9 <= dVar1) {
        return __return_storage_ptr__;
      }
      local_68 = dVar9 - dVar1;
    }
  }
  else {
    local_68 = dVar1;
    if (dVar1 <= 0.0) {
      return __return_storage_ptr__;
    }
  }
  pdVar2 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  lVar5 = 0;
  for (lVar6 = 0;
      pdVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, lVar6 < this->max_apertures; lVar6 = lVar6 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->last_intensity,(value_type_conflict1 *)((long)pdVar2 + lVar5));
    lVar5 = lVar5 + 8;
  }
  pdVar2[aperture] = pdVar2[aperture] + local_68;
  for (uVar7 = 0; iVar3 = Collimator::getXdim(this->collimator), (long)uVar7 < (long)iVar3;
      uVar7 = uVar7 + 1) {
    lVar5 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar6 = (long)*(int *)(lVar5 + uVar7 * 8);
    if ((-1 < lVar6) && (-1 < *(int *)(lVar5 + 4 + uVar7 * 8))) {
      local_58._0_8_ = lVar6 << 0x20 | uVar7;
      pmVar4 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->pos2beam,(key_type *)&local_58);
      mVar8 = *pmVar4;
      lVar5 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      for (iVar3 = *(int *)(lVar5 + uVar7 * 8); iVar3 <= *(int *)(lVar5 + 4 + uVar7 * 8);
          iVar3 = iVar3 + 1) {
        local_58.first = mVar8;
        local_58.second = local_68;
        std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        push_back(__return_storage_ptr__,&local_58);
        mVar8 = mVar8 + 1;
        lVar5 = *(long *)&(this->A).
                          super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[aperture].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data;
      }
    }
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_48,
             __return_storage_ptr__);
  updateIntensity(this,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_48);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&local_48);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (&this->last_diff,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

list <pair< int,double> > Station::modifyIntensityAperture(int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    
    // Save previous intensity
    last_intensity.clear();
    for (int i=0;i<max_apertures;i++) 
      last_intensity.push_back(intensity[i]);
    
    intensity[aperture] = intensity[aperture] + size;

    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    updateIntensity(diff);
    last_diff = diff;
    return (diff);
  }